

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

bool leveldb::ConsumeDecimalNumber(Slice *in,uint64_t *val)

{
  byte bVar1;
  long lVar2;
  size_t n;
  size_t sVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = 0;
  uVar4 = 0;
  do {
    n = in->size_;
    if ((in->size_ == sVar3) || (bVar1 = in->data_[sVar3], n = sVar3, (byte)(bVar1 - 0x3a) < 0xf6))
    {
      *val = uVar4;
      bVar5 = n != 0;
      Slice::remove_prefix(in,n);
LAB_00a4a6b0:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return bVar5;
    }
    if ((0x1999999999999999 < uVar4) || (uVar4 == 0x1999999999999999 && 0x35 < bVar1)) {
      bVar5 = false;
      goto LAB_00a4a6b0;
    }
    uVar4 = (ulong)(bVar1 & 0xf) + uVar4 * 10;
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

bool ConsumeDecimalNumber(Slice* in, uint64_t* val) {
  // Constants that will be optimized away.
  constexpr const uint64_t kMaxUint64 = std::numeric_limits<uint64_t>::max();
  constexpr const char kLastDigitOfMaxUint64 =
      '0' + static_cast<char>(kMaxUint64 % 10);

  uint64_t value = 0;

  // reinterpret_cast-ing from char* to uint8_t* to avoid signedness.
  const uint8_t* start = reinterpret_cast<const uint8_t*>(in->data());

  const uint8_t* end = start + in->size();
  const uint8_t* current = start;
  for (; current != end; ++current) {
    const uint8_t ch = *current;
    if (ch < '0' || ch > '9') break;

    // Overflow check.
    // kMaxUint64 / 10 is also constant and will be optimized away.
    if (value > kMaxUint64 / 10 ||
        (value == kMaxUint64 / 10 && ch > kLastDigitOfMaxUint64)) {
      return false;
    }

    value = (value * 10) + (ch - '0');
  }

  *val = value;
  const size_t digits_consumed = current - start;
  in->remove_prefix(digits_consumed);
  return digits_consumed != 0;
}